

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_keys_values.cpp
# Opt level: O2

ScalarFunction * duckdb::MapKeysFun::GetFunction(void)

{
  LogicalType varargs;
  ScalarFunction *in_RDI;
  undefined4 in_stack_fffffffffffffea4;
  undefined4 in_stack_fffffffffffffeac;
  undefined1 null_handling;
  undefined8 bind_lambda;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_128;
  LogicalType local_108;
  LogicalType local_f0;
  LogicalType local_d8;
  BaseScalarFunction local_c0;
  
  local_128.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  LogicalType::LogicalType(&local_108,LIST);
  bind_lambda = (bind_lambda_function_t)0x0;
  null_handling = 0xfc;
  LogicalType::LogicalType(&local_f0,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_f0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_fffffffffffffea4;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_fffffffffffffeac;
  ScalarFunction::ScalarFunction
            (in_RDI,(vector<duckdb::LogicalType,_true> *)&local_128,&local_108,
             (scalar_function_t *)&stack0xfffffffffffffeb8,MapKeysBind,
             (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,(init_local_state_t)0x0
             ,varargs,CONSISTENT,null_handling,(bind_lambda_function_t)bind_lambda);
  LogicalType::~LogicalType(&local_f0);
  ::std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffffeb8);
  LogicalType::~LogicalType(&local_108);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_128);
  (in_RDI->super_BaseScalarFunction).null_handling = SPECIAL_HANDLING;
  BaseScalarFunction::SetReturnsError(&local_c0,&in_RDI->super_BaseScalarFunction);
  BaseScalarFunction::~BaseScalarFunction(&local_c0);
  LogicalType::LogicalType(&local_d8,ANY);
  LogicalType::operator=(&(in_RDI->super_BaseScalarFunction).super_SimpleFunction.varargs,&local_d8)
  ;
  LogicalType::~LogicalType(&local_d8);
  return in_RDI;
}

Assistant:

ScalarFunction MapKeysFun::GetFunction() {
	//! the arguments and return types are actually set in the binder function
	ScalarFunction function({}, LogicalTypeId::LIST, MapKeysFunction, MapKeysBind);
	function.null_handling = FunctionNullHandling::SPECIAL_HANDLING;
	BaseScalarFunction::SetReturnsError(function);
	function.varargs = LogicalType::ANY;
	return function;
}